

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void * flatcc_json_printer_finalize_dynamic_buffer(flatcc_json_printer_t *ctx,size_t *buffer_size)

{
  void *pvVar1;
  void *buffer;
  size_t *buffer_size_local;
  flatcc_json_printer_t *ctx_local;
  
  pvVar1 = flatcc_json_printer_get_buffer(ctx,buffer_size);
  memset(ctx,0,0x50);
  return pvVar1;
}

Assistant:

void *flatcc_json_printer_finalize_dynamic_buffer(flatcc_json_printer_t *ctx, size_t *buffer_size)
{
    void *buffer;

    buffer = flatcc_json_printer_get_buffer(ctx, buffer_size);
    memset(ctx, 0, sizeof(*ctx));
    return buffer;
}